

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipc.c
# Opt level: O0

void nn_cipc_start_connecting(nn_cipc *self)

{
  int iVar1;
  nn_usock *self_00;
  size_t sVar2;
  long in_RDI;
  size_t sz;
  int val;
  char *addr;
  sockaddr_un *un;
  sockaddr_storage ss;
  int rc;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  nn_backoff *in_stack_ffffffffffffff50;
  long lVar3;
  nn_ep *self_01;
  nn_usock *in_stack_ffffffffffffff58;
  void *in_stack_ffffffffffffff60;
  nn_usock *in_stack_ffffffffffffff68;
  undefined1 *puVar4;
  undefined2 in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff72;
  
  iVar1 = nn_usock_start(in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                         (int)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  if (iVar1 < 0) {
    nn_backoff_start(in_stack_ffffffffffffff50);
    *(undefined4 *)(in_RDI + 0x58) = 6;
  }
  else {
    lVar3 = 4;
    nn_ep_getopt((nn_ep *)CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70),
                 (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68,
                 in_stack_ffffffffffffff60,(size_t *)in_stack_ffffffffffffff58);
    if (lVar3 != 4) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (val)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ipc/cipc.c"
              ,0x185);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_usock_setsockopt(in_stack_ffffffffffffff68,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                        (int)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,4);
    self_01 = (nn_ep *)0x4;
    nn_ep_getopt((nn_ep *)CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70),
                 (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(int)in_stack_ffffffffffffff68,
                 in_stack_ffffffffffffff60,(size_t *)in_stack_ffffffffffffff58);
    if (self_01 != (nn_ep *)0x4) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (val)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ipc/cipc.c"
              ,0x18a);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_usock_setsockopt(in_stack_ffffffffffffff68,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                        (int)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,4);
    self_00 = (nn_usock *)nn_ep_getaddr(*(nn_ep **)(in_RDI + 0x60));
    memset(&stack0xffffffffffffff70,0,0x80);
    puVar4 = &stack0xffffffffffffff70;
    sVar2 = strlen((char *)self_00);
    if (0x6b < sVar2) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","strlen (addr) < sizeof (un->sun_path)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ipc/cipc.c"
              ,0x192);
      fflush(_stderr);
      nn_err_abort();
    }
    strncpy(puVar4 + 2,(char *)self_00,0x6c);
    nn_usock_connect(self_00,(sockaddr *)in_stack_ffffffffffffff58,(size_t)self_01);
    *(undefined4 *)(in_RDI + 0x58) = 2;
    nn_ep_stat_increment(self_01,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
  }
  return;
}

Assistant:

static void nn_cipc_start_connecting (struct nn_cipc *self)
{
    int rc;
    struct sockaddr_storage ss;
    struct sockaddr_un *un;
    const char *addr;
    int val;
    size_t sz;

    /*  Try to start the underlying socket. */
    rc = nn_usock_start (&self->usock, AF_UNIX, SOCK_STREAM, 0);
    if (nn_slow (rc < 0)) {
        nn_backoff_start (&self->retry);
        self->state = NN_CIPC_STATE_WAITING;
        return;
    }

    /*  Set the relevant socket options. */
    sz = sizeof (val);
    nn_ep_getopt (self->ep, NN_SOL_SOCKET, NN_SNDBUF, &val, &sz);
    nn_assert (sz == sizeof (val));
    nn_usock_setsockopt (&self->usock, SOL_SOCKET, SO_SNDBUF,
        &val, sizeof (val));
    sz = sizeof (val);
    nn_ep_getopt (self->ep, NN_SOL_SOCKET, NN_RCVBUF, &val, &sz);
    nn_assert (sz == sizeof (val));
    nn_usock_setsockopt (&self->usock, SOL_SOCKET, SO_RCVBUF,
        &val, sizeof (val));

    /*  Create the IPC address from the address string. */
    addr = nn_ep_getaddr (self->ep);
    memset (&ss, 0, sizeof (ss));
    un = (struct sockaddr_un*) &ss;
    nn_assert (strlen (addr) < sizeof (un->sun_path));
    ss.ss_family = AF_UNIX;
    strncpy (un->sun_path, addr, sizeof (un->sun_path));

#if defined NN_HAVE_WINDOWS
    /* Get/Set security attribute pointer*/
    nn_ep_getopt (self->ep, NN_IPC, NN_IPC_SEC_ATTR, &self->usock.sec_attr, &sz);

    nn_ep_getopt (self->ep, NN_IPC, NN_IPC_OUTBUFSZ, &self->usock.outbuffersz, &sz);
    nn_ep_getopt (self->ep, NN_IPC, NN_IPC_INBUFSZ, &self->usock.inbuffersz, &sz);
#endif

    /*  Start connecting. */
    nn_usock_connect (&self->usock, (struct sockaddr*) &ss,
        sizeof (struct sockaddr_un));
    self->state  = NN_CIPC_STATE_CONNECTING;

    nn_ep_stat_increment (self->ep, NN_STAT_INPROGRESS_CONNECTIONS, 1);
}